

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraph_p.h
# Opt level: O0

AnchorData * __thiscall
Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::takeEdge
          (Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData> *this,
          AnchorVertex *first,AnchorVertex *second)

{
  AnchorData *pAVar1;
  Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData> *in_RDX;
  AnchorData *data;
  AnchorVertex *in_stack_00000030;
  AnchorVertex *in_stack_00000038;
  Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>
  *in_stack_ffffffffffffffe0;
  
  pAVar1 = edgeData(in_stack_ffffffffffffffe0,in_stack_00000038,in_stack_00000030);
  if (pAVar1 != (AnchorData *)0x0) {
    removeDirectedEdge(in_RDX,first,second);
    removeDirectedEdge(in_RDX,first,second);
  }
  return pAVar1;
}

Assistant:

EdgeData *takeEdge(Vertex* first, Vertex* second)
    {
#if defined(QT_DEBUG) && 0
        qDebug("Graph::takeEdge(): %s",
               qPrintable(QString::fromLatin1("%1-%2")
                          .arg(first->toString()).arg(second->toString())));
#endif
        // Removes a bidirectional edge
        EdgeData *data = edgeData(first, second);
        if (data) {
            removeDirectedEdge(first, second);
            removeDirectedEdge(second, first);
        }
        return data;
    }